

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

DistributionMapping
amrex::DistributionMapping::makeSFC
          (Vector<double,_std::allocator<double>_> *rcost,BoxArray *ba,bool sort)

{
  reference pdVar1;
  long lVar2;
  Long LVar3;
  double *pdVar4;
  long *plVar5;
  byte in_CL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  element_type *in_RDI;
  literals *this;
  longdouble lVar7;
  BoxArray *pBVar8;
  DistributionMapping DVar9;
  int nprocs;
  int i;
  Real scale;
  Real wmax;
  Vector<long,_std::allocator<long>_> cost;
  DistributionMapping *r;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  size_type i_00;
  undefined2 in_stack_ffffffffffffff20;
  undefined2 uVar10;
  undefined6 in_stack_ffffffffffffff22;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff30;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff38;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff40;
  BoxArray *boxes;
  BoxArray *in_stack_ffffffffffffff50;
  int local_7c;
  double *local_60;
  double local_58;
  byte local_1a;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  DistributionMapping((DistributionMapping *)0x11f9b14);
  Vector<double,_std::allocator<double>_>::size
            ((Vector<double,_std::allocator<double>_> *)0x11f9b21);
  std::allocator<long>::allocator((allocator<long> *)0x11f9b38);
  Vector<long,_std::allocator<long>_>::vector
            ((Vector<long,_std::allocator<long>_> *)
             CONCAT62(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20),
             (size_type)in_stack_ffffffffffffff18,(allocator_type *)0x11f9b4f);
  std::allocator<long>::~allocator((allocator<long> *)0x11f9b5e);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff18);
  local_60 = (double *)
             std::
             max_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                       (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  this = (literals *)&local_60;
  pdVar1 = __gnu_cxx::
           __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      *)this);
  local_58 = *pdVar1;
  if ((local_58 != 0.0) || (NAN(local_58))) {
    lVar7 = (longdouble)1e+09;
    i_00 = SUB108(lVar7,0);
    uVar10 = (undefined2)((unkuint10)lVar7 >> 0x40);
    in_stack_ffffffffffffff40 =
         (vector<long,_std::allocator<long>_> *)literals::operator____rt(this,lVar7);
    pBVar8 = (BoxArray *)((double)in_stack_ffffffffffffff40 / local_58);
  }
  else {
    lVar7 = (longdouble)1e+09;
    i_00 = SUB108(lVar7,0);
    uVar10 = (undefined2)((unkuint10)lVar7 >> 0x40);
    pBVar8 = (BoxArray *)literals::operator____rt(this,lVar7);
    in_stack_ffffffffffffff50 = pBVar8;
  }
  local_7c = 0;
  boxes = pBVar8;
  while( true ) {
    lVar2 = (long)local_7c;
    LVar3 = Vector<double,_std::allocator<double>_>::size
                      ((Vector<double,_std::allocator<double>_> *)0x11f9c57);
    if (LVar3 <= lVar2) break;
    pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)
                        CONCAT62(in_stack_ffffffffffffff22,uVar10),i_00);
    lVar2 = (long)(*pdVar4 * (double)pBVar8) + 1;
    plVar5 = Vector<long,_std::allocator<long>_>::operator[]
                       ((Vector<long,_std::allocator<long>_> *)
                        CONCAT62(in_stack_ffffffffffffff22,uVar10),i_00);
    *plVar5 = lVar2;
    local_7c = local_7c + 1;
  }
  ParallelContext::NProcsSub();
  SFCProcessorMap((DistributionMapping *)in_stack_ffffffffffffff50,boxes,in_stack_ffffffffffffff40,
                  (int)((ulong)lVar2 >> 0x20),SUB81((ulong)lVar2 >> 0x18,0));
  local_1a = 1;
  Vector<long,_std::allocator<long>_>::~Vector((Vector<long,_std::allocator<long>_> *)0x11f9d4d);
  _Var6._M_pi = extraout_RDX;
  if ((local_1a & 1) == 0) {
    ~DistributionMapping((DistributionMapping *)0x11f9d61);
    _Var6._M_pi = extraout_RDX_00;
  }
  DVar9.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  DVar9.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (DistributionMapping)
         DVar9.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

DistributionMapping
DistributionMapping::makeSFC (const Vector<Real>& rcost, const BoxArray& ba, bool sort)
{
    BL_PROFILE("makeSFC");

    DistributionMapping r;

    Vector<Long> cost(rcost.size());

    Real wmax = *std::max_element(rcost.begin(), rcost.end());
    Real scale = (wmax == 0) ? 1.e9_rt : 1.e9_rt/wmax;

    for (int i = 0; i < rcost.size(); ++i) {
        cost[i] = Long(rcost[i]*scale) + 1L;
    }

    int nprocs = ParallelContext::NProcsSub();

    r.SFCProcessorMap(ba, cost, nprocs, sort);

    return r;
}